

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int write_data(spng_ctx *ctx,void *data,size_t bytes)

{
  int iVar1;
  int local_2c;
  int ret_1;
  int ret;
  size_t bytes_local;
  void *data_local;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    ctx_local._4_4_ = 0x50;
  }
  else if (bytes == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    if ((*(ushort *)&ctx->field_0xcc & 1) == 0) {
      iVar1 = require_bytes(ctx,bytes);
      if (iVar1 != 0) {
        iVar1 = encode_err(ctx,iVar1);
        return iVar1;
      }
      memcpy(ctx->write_ptr,data,bytes);
      ctx->write_ptr = ctx->write_ptr + bytes;
    }
    else {
      if (0x2000 < bytes) {
        return 0x50;
      }
      local_2c = (*(code *)ctx->write_fn)(ctx,ctx->stream_user_ptr,data,bytes);
      if (local_2c != 0) {
        if ((0 < local_2c) || (local_2c < -2)) {
          local_2c = -2;
        }
        iVar1 = encode_err(ctx,local_2c);
        return iVar1;
      }
    }
    ctx->bytes_encoded = bytes + ctx->bytes_encoded;
    if (ctx->bytes_encoded < bytes) {
      ctx_local._4_4_ = 3;
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int write_data(spng_ctx *ctx, const void *data, size_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;
    if(!bytes) return 0;

    if(ctx->streaming)
    {
        if(bytes > SPNG_WRITE_SIZE) return SPNG_EINTERNAL;

        int ret = ctx->write_fn(ctx, ctx->stream_user_ptr, (void*)data, bytes);

        if(ret)
        {
            if(ret > 0 || ret < SPNG_IO_ERROR) ret = SPNG_IO_ERROR;

            return encode_err(ctx, ret);
        }
    }
    else
    {
        int ret = require_bytes(ctx, bytes);
        if(ret) return encode_err(ctx, ret);

        memcpy(ctx->write_ptr, data, bytes);

        ctx->write_ptr += bytes;
    }

    ctx->bytes_encoded += bytes;
    if(ctx->bytes_encoded < bytes) return SPNG_EOVERFLOW;

    return 0;
}